

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_GlyphSlot_Load(FT_GlyphSlot glyph,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Module_Class *pFVar1;
  int iVar2;
  ulong uVar3;
  FT_Driver_Class ttclazz;
  T42_Face t42face;
  T42_Size t42size;
  T42_GlyphSlot t42slot;
  FT_Error error;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size size_local;
  FT_GlyphSlot glyph_local;
  
  pFVar1 = glyph->face->driver[1].root.clazz;
  uVar3 = strtol((char *)(&(size->face[2].size)->face)[glyph_index],(char **)0x0,10);
  t42_glyphslot_clear((FT_GlyphSlot)glyph[1].library);
  iVar2 = (*(code *)pFVar1[2].module_flags)
                    (glyph[1].library,size[1].face,uVar3 & 0xffffffff,(long)load_flags | 8);
  if (iVar2 == 0) {
    memcpy(&glyph->metrics,(glyph[1].library)->modules + 3,0x40);
    glyph->linearHoriAdvance = (FT_Fixed)(glyph[1].library)->modules[0xb];
    glyph->linearVertAdvance = (FT_Fixed)(glyph[1].library)->modules[0xc];
    glyph->format = *(FT_Glyph_Format *)((glyph[1].library)->modules + 0xf);
    memcpy(&glyph->outline,(glyph[1].library)->modules + 0x16,0x28);
    memcpy(&glyph->bitmap,(glyph[1].library)->modules + 0x10,0x28);
    glyph->bitmap_left = *(FT_Int *)((glyph[1].library)->modules + 0x15);
    glyph->bitmap_top = *(FT_Int *)((long)(glyph[1].library)->modules + 0xac);
    glyph->num_subglyphs = *(FT_UInt *)((glyph[1].library)->modules + 0x1b);
    glyph->subglyphs = (FT_SubGlyph)(glyph[1].library)->modules[0x1c];
    glyph->control_data = (glyph[1].library)->modules[0x1d];
    glyph->control_len = (long)(glyph[1].library)->modules[0x1e];
  }
  return iVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_GlyphSlot_Load( FT_GlyphSlot  glyph,
                      FT_Size       size,
                      FT_UInt       glyph_index,
                      FT_Int32      load_flags )
  {
    FT_Error         error;
    T42_GlyphSlot    t42slot = (T42_GlyphSlot)glyph;
    T42_Size         t42size = (T42_Size)size;
    T42_Face         t42face = (T42_Face)size->face;
    FT_Driver_Class  ttclazz = ((T42_Driver)glyph->face->driver)->ttclazz;


    FT_TRACE1(( "T42_GlyphSlot_Load: glyph index %d\n", glyph_index ));

    /* map T42 glyph index to embedded TTF's glyph index */
    glyph_index = (FT_UInt)ft_strtol(
                    (const char *)t42face->type1.charstrings[glyph_index],
                    NULL, 10 );

    t42_glyphslot_clear( t42slot->ttslot );
    error = ttclazz->load_glyph( t42slot->ttslot,
                                 t42size->ttsize,
                                 glyph_index,
                                 load_flags | FT_LOAD_NO_BITMAP );

    if ( !error )
    {
      glyph->metrics = t42slot->ttslot->metrics;

      glyph->linearHoriAdvance = t42slot->ttslot->linearHoriAdvance;
      glyph->linearVertAdvance = t42slot->ttslot->linearVertAdvance;

      glyph->format  = t42slot->ttslot->format;
      glyph->outline = t42slot->ttslot->outline;

      glyph->bitmap      = t42slot->ttslot->bitmap;
      glyph->bitmap_left = t42slot->ttslot->bitmap_left;
      glyph->bitmap_top  = t42slot->ttslot->bitmap_top;

      glyph->num_subglyphs = t42slot->ttslot->num_subglyphs;
      glyph->subglyphs     = t42slot->ttslot->subglyphs;

      glyph->control_data  = t42slot->ttslot->control_data;
      glyph->control_len   = t42slot->ttslot->control_len;
    }

    return error;
  }